

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall
ON_SurfaceCurvatureColorMapping::Hash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SurfaceCurvatureColorMapping *this)

{
  bool bVar1;
  undefined1 auStack_a0 [4];
  uint u;
  ON_UUID uniqueness_boost;
  ON_SHA1 sha1;
  ON_SurfaceCurvatureColorMapping *this_local;
  
  bVar1 = IsSet(this);
  if (bVar1) {
    ON_SHA1::ON_SHA1((ON_SHA1 *)uniqueness_boost.Data4);
    auStack_a0 = (undefined1  [4])0x639e9144;
    u._0_2_ = 0x1c1a;
    u._2_2_ = 0x4bba;
    uniqueness_boost._0_8_ = (uchar  [8])0x697b0df530d34882;
    ON_SHA1::AccumulateId((ON_SHA1 *)uniqueness_boost.Data4,(ON_UUID *)auStack_a0);
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)uniqueness_boost.Data4,this->m_kappa_style);
    ON_SHA1::AccumulateDoubleArray((ON_SHA1 *)uniqueness_boost.Data4,2,(this->m_kappa_range).m_t);
    ON_SHA1::AccumulateDoubleArray
              ((ON_SHA1 *)uniqueness_boost.Data4,2,(this->m_hue_range_in_radians).m_t);
    ON_SHA1::Hash(__return_storage_ptr__,(ON_SHA1 *)uniqueness_boost.Data4);
  }
  else {
    *(undefined8 *)__return_storage_ptr__->m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)(__return_storage_ptr__->m_digest + 8) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SurfaceCurvatureColorMapping::Hash() const
{
  if (this->IsSet())
  {
    ON_SHA1 sha1;

    // The uuid is accumulated because an int,double,double could easily
    // be the intput data int many unrelated contexts. This sha1 is used
    // to avoid expensive recalculations of curvatures and their false colors.
    const ON_UUID uniqueness_boost = ON_SurfaceCurvatureColorMapping::Id;
    sha1.AccumulateId(uniqueness_boost);

    const unsigned u = (unsigned)this->m_kappa_style;
    sha1.AccumulateInteger32(u);

    sha1.AccumulateDoubleArray(2, this->m_kappa_range.m_t);

    sha1.AccumulateDoubleArray(2, this->m_hue_range_in_radians.m_t);

    return sha1.Hash();
  }
  return ON_SHA1_Hash::EmptyContentHash;
}